

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O2

void osQueue::dump_info(ostream *out)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  
  osMutex::Take(&QueueListLock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0xaa);
  for (lVar3 = 0; lVar3 != 0xa0; lVar3 = lVar3 + 8) {
    lVar1 = *(long *)((long)QueueList + lVar3);
    if (lVar1 != 0) {
      poVar2 = std::operator<<(out,"Queue ");
      std::operator<<(poVar2,*(char **)(lVar1 + 8));
      poVar2 = std::operator<<(out," is size ");
      std::ostream::operator<<(poVar2,*(int *)(lVar1 + 0x18));
      poVar2 = std::operator<<(out," and contains ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(lVar1 + 0x1c));
      std::operator<<(poVar2," objects\n");
    }
  }
  osMutex::Give(&QueueListLock);
  return;
}

Assistant:

void osQueue::dump_info(std::ostream& out)
{
    QueueListLock.Take(__FILE__, __LINE__);
    for (size_t i = 0; i < MAX_QUEUE_COUNT; i++)
    {
        osQueue* queue = QueueList[i];
        if (queue != nullptr)
        {
            out << "Queue " << queue->GetName();
            out << " is size " << queue->MaxElements;
            out << " and contains " << queue->GetCount() << " objects\n";
            // This is hanging
            // can't lock the queue and tx tcp frames as it can deadlock
            // tx tcp locks queues
            // might be a better way to do this
            //         queue->Lock.Take( __FILE__, __LINE__ );
            //         int      index = queue->NextOutIndex;
            //         for( int j = 0; j<queue->GetCount(); j++ )
            //         {
            //            pfunc->Printf( "   Object at 0x%08X\n", queue->Array[ index ] );
            //            index = queue->Increment( index );
            //         }
            //         queue->Lock.Give();
        }
    }

    QueueListLock.Give();
}